

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco_Apu.cpp
# Opt level: O1

void __thiscall Nes_Namco_Apu::reset(Nes_Namco_Apu *this)

{
  long lVar1;
  
  memset(&this->last_time,0,0x88);
  lVar1 = 0x12;
  do {
    *(undefined4 *)((long)this->oscs + lVar1 + -0x12) = 0;
    *(undefined4 *)((long)this->oscs + lVar1 + -2) = 0;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xd2);
  return;
}

Assistant:

void Nes_Namco_Apu::reset()
{
	last_time = 0;
	addr_reg = 0;
	
	int i;
	for ( i = 0; i < reg_count; i++ )
		reg [i] = 0;
	
	for ( i = 0; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		osc.delay = 0;
		osc.last_amp = 0;
		osc.wave_pos = 0;
	}
}